

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O2

int xmlRegExecGetValues(xmlRegExecCtxtPtr exec,int err,int *nbval,int *nbneg,xmlChar **values,
                       int *terminal)

{
  xmlRegexpPtr pxVar1;
  xmlRegTrans *pxVar2;
  long lVar3;
  xmlRegCounter *pxVar4;
  xmlRegStatePtr pxVar5;
  int iVar6;
  xmlGenericErrorFunc *pp_Var7;
  void **ppvVar8;
  xmlChar *pxVar9;
  long lVar10;
  undefined8 uVar11;
  xmlRegStatePtr pxVar12;
  int iVar13;
  long lVar14;
  int iVar15;
  void *pvVar16;
  long lVar17;
  ulong uVar18;
  long lVar19;
  undefined4 in_R10D;
  int iVar20;
  int iVar21;
  xmlGenericErrorFunc p_Var22;
  int iVar23;
  long lVar24;
  undefined1 auVar25 [16];
  
  auVar25._0_4_ = -(uint)(exec == (xmlRegExecCtxtPtr)0x0);
  auVar25._4_4_ = -(uint)(nbval == (int *)0x0);
  auVar25._8_4_ = -(uint)(nbneg == (int *)0x0);
  auVar25._12_4_ = -(uint)(values == (xmlChar **)0x0);
  iVar20 = movmskps(in_R10D,auVar25);
  iVar6 = -1;
  if (iVar20 != 0) {
    return iVar6;
  }
  iVar20 = *nbval;
  if (0 < iVar20) {
    *nbval = 0;
    *nbneg = 0;
    pxVar1 = exec->comp;
    if ((pxVar1 == (xmlRegexpPtr)0x0) || (pxVar1->compact == (int *)0x0)) {
      if (terminal != (int *)0x0) {
        *terminal = (uint)(exec->state->type == XML_REGEXP_FINAL_STATE);
      }
      if (err == 0) {
        pxVar12 = exec->state;
      }
      else {
        pxVar12 = exec->errState;
      }
      if (pxVar12 != (xmlRegStatePtr)0x0) {
        lVar10 = 0x88;
        if (err == 0) {
          lVar10 = 0x40;
        }
        lVar19 = 0x10;
        lVar24 = 0;
        iVar23 = 0;
        while ((uVar18 = (ulong)pxVar12->nbTrans, lVar24 < (long)uVar18 && (iVar23 < iVar20))) {
          pxVar2 = pxVar12->trans;
          lVar14 = (long)*(int *)((long)pxVar2 + lVar19 + -8);
          if ((lVar14 < 0) ||
             ((lVar3 = *(long *)((long)pxVar2 + lVar19 + -0x10), lVar3 == 0 ||
              (pxVar9 = *(xmlChar **)(lVar3 + 0x18), pxVar9 == (xmlChar *)0x0)))) goto LAB_001a064d;
          iVar6 = *(int *)((long)&pxVar2->atom + lVar19);
          if (iVar6 == 0x123456) {
            pp_Var7 = __xmlGenericError();
            p_Var22 = *pp_Var7;
            ppvVar8 = __xmlGenericErrorContext();
            pvVar16 = *ppvVar8;
            uVar11 = 0x1110;
LAB_001a05cd:
            (*p_Var22)(pvVar16,"Unimplemented block at %s:%d\n",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JFLarvoire[P]libxml2/xmlregexp.c"
                       ,uVar11);
          }
          else {
            if (iVar6 == 0x123457) {
              pp_Var7 = __xmlGenericError();
              p_Var22 = *pp_Var7;
              ppvVar8 = __xmlGenericErrorContext();
              pvVar16 = *ppvVar8;
              uVar11 = 0x110d;
              goto LAB_001a05cd;
            }
            lVar17 = (long)*(int *)((long)pxVar2 + lVar19 + -4);
            if (lVar17 < 0) {
              if (((exec->comp != (xmlRegexpPtr)0x0) &&
                  (pxVar5 = exec->comp->states[lVar14], pxVar5 != (xmlRegStatePtr)0x0)) &&
                 (pxVar5->type != XML_REGEXP_SINK_STATE)) goto LAB_001a0630;
            }
            else if (((exec->comp == (xmlRegexpPtr)0x0) ||
                     (pxVar4 = exec->comp->counters, pxVar4 == (xmlRegCounter *)0x0)) ||
                    (*(int *)(*(long *)((long)&exec->status + lVar10) + lVar17 * 4) <
                     pxVar4[lVar17].max)) {
LAB_001a0630:
              if (*(int *)(lVar3 + 0x28) != 0) {
                pxVar9 = *(xmlChar **)(lVar3 + 0x20);
              }
              values[iVar23] = pxVar9;
              iVar23 = iVar23 + 1;
              *nbval = *nbval + 1;
            }
          }
LAB_001a064d:
          lVar24 = lVar24 + 1;
          lVar19 = lVar19 + 0x18;
        }
        lVar10 = 0x10;
        iVar6 = 0;
        lVar19 = 0;
        while ((lVar19 < (int)uVar18 && (iVar23 < iVar20))) {
          pxVar2 = pxVar12->trans;
          lVar24 = (long)*(int *)((long)pxVar2 + lVar10 + -8);
          if ((((-1 < lVar24) &&
               (((lVar14 = *(long *)((long)pxVar2 + lVar10 + -0x10), lVar14 != 0 &&
                 (pxVar9 = *(xmlChar **)(lVar14 + 0x18), pxVar9 != (xmlChar *)0x0)) &&
                ((*(uint *)((long)&pxVar2->atom + lVar10) & 0xfffffffe) != 0x123456)))) &&
              ((*(int *)((long)pxVar2 + lVar10 + -4) < 0 &&
               (pxVar5 = exec->comp->states[lVar24], pxVar5 != (xmlRegStatePtr)0x0)))) &&
             (pxVar5->type == XML_REGEXP_SINK_STATE)) {
            if (*(int *)(lVar14 + 0x28) != 0) {
              pxVar9 = *(xmlChar **)(lVar14 + 0x20);
            }
            values[iVar23] = pxVar9;
            iVar23 = iVar23 + 1;
            *nbneg = *nbneg + 1;
            uVar18 = (ulong)(uint)pxVar12->nbTrans;
          }
          lVar19 = lVar19 + 1;
          lVar10 = lVar10 + 0x18;
        }
      }
    }
    else {
      if (err == 0) {
        iVar23 = exec->index;
      }
      else {
        iVar23 = exec->errStateNo;
        if (iVar23 == -1) {
          return -1;
        }
      }
      if (terminal != (int *)0x0) {
        *terminal = (uint)(pxVar1->compact[(long)iVar23 * ((long)pxVar1->nbstrings + 1)] == 2);
      }
      lVar10 = 0;
      iVar13 = 0;
      while( true ) {
        uVar18 = (ulong)pxVar1->nbstrings;
        if (((long)uVar18 <= lVar10) || (iVar20 <= iVar13)) break;
        iVar15 = pxVar1->nbstrings + 1;
        iVar6 = pxVar1->compact[(long)(iVar15 * iVar23 + (int)lVar10) + 1];
        if (((0 < iVar6) && (iVar6 <= pxVar1->nbstates)) &&
           (pxVar1->compact[(iVar6 + -1) * iVar15] != 4)) {
          lVar19 = (long)iVar13;
          iVar13 = iVar13 + 1;
          values[lVar19] = pxVar1->stringMap[lVar10];
          *nbval = *nbval + 1;
        }
        lVar10 = lVar10 + 1;
      }
      iVar6 = 0;
      lVar10 = 0;
      while ((lVar10 < (int)uVar18 && (iVar13 < iVar20))) {
        iVar21 = (int)uVar18 + 1;
        iVar15 = pxVar1->compact[(long)(iVar21 * iVar23 + (int)lVar10) + 1];
        if ((0 < iVar15) &&
           ((iVar15 <= pxVar1->nbstates && (pxVar1->compact[(iVar15 + -1) * iVar21] == 4)))) {
          lVar19 = (long)iVar13;
          iVar13 = iVar13 + 1;
          values[lVar19] = pxVar1->stringMap[lVar10];
          *nbneg = *nbneg + 1;
          uVar18 = (ulong)(uint)pxVar1->nbstrings;
        }
        lVar10 = lVar10 + 1;
      }
    }
  }
  return iVar6;
}

Assistant:

static int
xmlRegExecGetValues(xmlRegExecCtxtPtr exec, int err,
                    int *nbval, int *nbneg,
		    xmlChar **values, int *terminal) {
    int maxval;
    int nb = 0;

    if ((exec == NULL) || (nbval == NULL) || (nbneg == NULL) ||
        (values == NULL) || (*nbval <= 0))
        return(-1);

    maxval = *nbval;
    *nbval = 0;
    *nbneg = 0;
    if ((exec->comp != NULL) && (exec->comp->compact != NULL)) {
        xmlRegexpPtr comp;
	int target, i, state;

        comp = exec->comp;

	if (err) {
	    if (exec->errStateNo == -1) return(-1);
	    state = exec->errStateNo;
	} else {
	    state = exec->index;
	}
	if (terminal != NULL) {
	    if (comp->compact[state * (comp->nbstrings + 1)] ==
	        XML_REGEXP_FINAL_STATE)
		*terminal = 1;
	    else
		*terminal = 0;
	}
	for (i = 0;(i < comp->nbstrings) && (nb < maxval);i++) {
	    target = comp->compact[state * (comp->nbstrings + 1) + i + 1];
	    if ((target > 0) && (target <= comp->nbstates) &&
	        (comp->compact[(target - 1) * (comp->nbstrings + 1)] !=
		 XML_REGEXP_SINK_STATE)) {
	        values[nb++] = comp->stringMap[i];
		(*nbval)++;
	    }
	}
	for (i = 0;(i < comp->nbstrings) && (nb < maxval);i++) {
	    target = comp->compact[state * (comp->nbstrings + 1) + i + 1];
	    if ((target > 0) && (target <= comp->nbstates) &&
	        (comp->compact[(target - 1) * (comp->nbstrings + 1)] ==
		 XML_REGEXP_SINK_STATE)) {
	        values[nb++] = comp->stringMap[i];
		(*nbneg)++;
	    }
	}
    } else {
        int transno;
	xmlRegTransPtr trans;
	xmlRegAtomPtr atom;
	xmlRegStatePtr state;

	if (terminal != NULL) {
	    if (exec->state->type == XML_REGEXP_FINAL_STATE)
		*terminal = 1;
	    else
		*terminal = 0;
	}

	if (err) {
	    if (exec->errState == NULL) return(-1);
	    state = exec->errState;
	} else {
	    if (exec->state == NULL) return(-1);
	    state = exec->state;
	}
	for (transno = 0;
	     (transno < state->nbTrans) && (nb < maxval);
	     transno++) {
	    trans = &state->trans[transno];
	    if (trans->to < 0)
		continue;
	    atom = trans->atom;
	    if ((atom == NULL) || (atom->valuep == NULL))
		continue;
	    if (trans->count == REGEXP_ALL_LAX_COUNTER) {
	        /* this should not be reached but ... */
	        TODO;
	    } else if (trans->count == REGEXP_ALL_COUNTER) {
	        /* this should not be reached but ... */
	        TODO;
	    } else if (trans->counter >= 0) {
		xmlRegCounterPtr counter = NULL;
		int count;

		if (err)
		    count = exec->errCounts[trans->counter];
		else
		    count = exec->counts[trans->counter];
		if (exec->comp != NULL)
		    counter = &exec->comp->counters[trans->counter];
		if ((counter == NULL) || (count < counter->max)) {
		    if (atom->neg)
			values[nb++] = (xmlChar *) atom->valuep2;
		    else
			values[nb++] = (xmlChar *) atom->valuep;
		    (*nbval)++;
		}
	    } else {
                if ((exec->comp != NULL) && (exec->comp->states[trans->to] != NULL) &&
		    (exec->comp->states[trans->to]->type !=
		     XML_REGEXP_SINK_STATE)) {
		    if (atom->neg)
			values[nb++] = (xmlChar *) atom->valuep2;
		    else
			values[nb++] = (xmlChar *) atom->valuep;
		    (*nbval)++;
		}
	    }
	}
	for (transno = 0;
	     (transno < state->nbTrans) && (nb < maxval);
	     transno++) {
	    trans = &state->trans[transno];
	    if (trans->to < 0)
		continue;
	    atom = trans->atom;
	    if ((atom == NULL) || (atom->valuep == NULL))
		continue;
	    if (trans->count == REGEXP_ALL_LAX_COUNTER) {
	        continue;
	    } else if (trans->count == REGEXP_ALL_COUNTER) {
	        continue;
	    } else if (trans->counter >= 0) {
	        continue;
	    } else {
                if ((exec->comp->states[trans->to] != NULL) &&
		    (exec->comp->states[trans->to]->type ==
		     XML_REGEXP_SINK_STATE)) {
		    if (atom->neg)
			values[nb++] = (xmlChar *) atom->valuep2;
		    else
			values[nb++] = (xmlChar *) atom->valuep;
		    (*nbneg)++;
		}
	    }
	}
    }
    return(0);
}